

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

object * __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
          (accessor<pybind11::detail::accessor_policies::tuple_item> *this)

{
  bool bVar1;
  object local_18;
  accessor<pybind11::detail::accessor_policies::tuple_item> *local_10;
  accessor<pybind11::detail::accessor_policies::tuple_item> *this_local;
  
  local_10 = this;
  bVar1 = handle::operator_cast_to_bool(&(this->cache).super_handle);
  if (!bVar1) {
    accessor_policies::tuple_item::get<unsigned_long,_0>
              ((tuple_item *)&local_18,(this->obj).m_ptr,&this->key);
    object::operator=(&this->cache,&local_18);
    object::~object(&local_18);
  }
  return &this->cache;
}

Assistant:

object &get_cache() const {
        if (!cache) {
            cache = Policy::get(obj, key);
        }
        return cache;
    }